

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaWildcardNsPtr xmlSchemaNewWildcardNsConstraint(xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaWildcardNsPtr ret;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x10);
  if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory(ctxt);
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ctxt_local->errCtxt = (void *)0x0;
    *(undefined8 *)ctxt_local = 0;
  }
  return (xmlSchemaWildcardNsPtr)ctxt_local;
}

Assistant:

static xmlSchemaWildcardNsPtr
xmlSchemaNewWildcardNsConstraint(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaWildcardNsPtr ret;

    ret = (xmlSchemaWildcardNsPtr)
	xmlMalloc(sizeof(xmlSchemaWildcardNs));
    if (ret == NULL) {
	xmlSchemaPErrMemory(ctxt);
	return (NULL);
    }
    ret->value = NULL;
    ret->next = NULL;
    return (ret);
}